

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_string.cpp
# Opt level: O2

string * __thiscall
duckdb::StandardStringCast<duckdb::interval_t>
          (string *__return_storage_ptr__,duckdb *this,interval_t input)

{
  interval_t input_00;
  LogicalType local_b0;
  anon_union_16_2_67f50693_for_value local_98;
  Vector v;
  
  LogicalType::LogicalType(&local_b0,VARCHAR);
  Vector::Vector(&v,&local_b0,0x800);
  LogicalType::~LogicalType(&local_b0);
  input_00.micros = input._0_8_;
  input_00._0_8_ = this;
  local_98.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)StringCast::Operation<duckdb::interval_t>(input_00,&v)
  ;
  string_t::GetString_abi_cxx11_(__return_storage_ptr__,(string_t *)&local_98.pointer);
  Vector::~Vector(&v);
  return __return_storage_ptr__;
}

Assistant:

string StandardStringCast(T input) {
	Vector v(LogicalType::VARCHAR);
	return StringCast::Operation(input, v).GetString();
}